

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O0

void Opcode::AABBTree::Walk::Local::_Walk
               (AABBTreeNode *current_node,udword *max_depth,udword *current_depth,
               WalkingCallback callback,void *user_data)

{
  bool bVar1;
  ulong uVar2;
  AABBTreeNode *local_80;
  long local_78;
  void *user_data_local;
  WalkingCallback callback_local;
  udword *current_depth_local;
  udword *max_depth_local;
  AABBTreeNode *current_node_local;
  AABBTreeNode *P_1;
  AABBTreeNode *P;
  
  if (current_node != (AABBTreeNode *)0x0) {
    *current_depth = *current_depth + 1;
    if (*max_depth < *current_depth) {
      *max_depth = *current_depth;
    }
    if ((callback == (WalkingCallback)0x0) ||
       (bVar1 = (*callback)(current_node,*current_depth,user_data), bVar1)) {
      if ((current_node->mPos & 0xfffffffffffffffe) != 0) {
        _Walk((AABBTreeNode *)(current_node->mPos & 0xfffffffffffffffe),max_depth,current_depth,
              callback,user_data);
        *current_depth = *current_depth - 1;
      }
      uVar2 = current_node->mPos & 0xfffffffffffffffe;
      if (uVar2 == 0) {
        local_78 = 0;
      }
      else {
        local_78 = uVar2 + 0x30;
      }
      if (local_78 != 0) {
        uVar2 = current_node->mPos & 0xfffffffffffffffe;
        if (uVar2 == 0) {
          local_80 = (AABBTreeNode *)0x0;
        }
        else {
          local_80 = (AABBTreeNode *)(uVar2 + 0x30);
        }
        _Walk(local_80,max_depth,current_depth,callback,user_data);
        *current_depth = *current_depth - 1;
      }
    }
  }
  return;
}

Assistant:

static void _Walk(const AABBTreeNode* current_node, udword& max_depth, udword& current_depth, WalkingCallback callback, void* user_data)
		{
			// Checkings
			if(!current_node)	return;
			// Entering a new node => increase depth
			current_depth++;
			// Keep track of max depth
			if(current_depth>max_depth)	max_depth = current_depth;

			// Callback
			if(callback && !(callback)(current_node, current_depth, user_data))	return;

			// Recurse
			if(current_node->GetPos())	{ _Walk(current_node->GetPos(), max_depth, current_depth, callback, user_data);	current_depth--;	}
			if(current_node->GetNeg())	{ _Walk(current_node->GetNeg(), max_depth, current_depth, callback, user_data);	current_depth--;	}
		}